

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O3

void __thiscall
flatbuffers::python::PythonGenerator::InitializeFromPackedBuf
          (PythonGenerator *this,StructDef *struct_def,string *code_ptr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  long *plVar3;
  long *plVar4;
  string struct_type;
  string struct_var;
  long *local_a0;
  long local_90;
  long lStack_88;
  string local_80;
  long *local_60 [2];
  long local_50 [2];
  long *local_40 [2];
  long local_30 [2];
  
  (*(this->namer_).super_Namer._vptr_Namer[7])(local_40,&this->namer_,struct_def);
  (*(this->namer_).super_Namer._vptr_Namer[0xf])(local_60,&this->namer_,struct_def);
  GenIndents_abi_cxx11_(&local_80,this,1);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_80);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_90 = *plVar3;
    lStack_88 = plVar2[3];
    local_a0 = &local_90;
  }
  else {
    local_90 = *plVar3;
    local_a0 = (long *)*plVar2;
  }
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_a0);
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  paVar1 = &local_80.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  GenIndents_abi_cxx11_(&local_80,this,1);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_80);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_90 = *plVar3;
    lStack_88 = plVar2[3];
    local_a0 = &local_90;
  }
  else {
    local_90 = *plVar3;
    local_a0 = (long *)*plVar2;
  }
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_a0);
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  GenIndents_abi_cxx11_(&local_80,this,2);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_80);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_90 = *plVar3;
    lStack_88 = plVar2[3];
    local_a0 = &local_90;
  }
  else {
    local_90 = *plVar3;
    local_a0 = (long *)*plVar2;
  }
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_a0);
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  GenIndents_abi_cxx11_(&local_80,this,2);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_80);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_90 = *plVar3;
    lStack_88 = plVar2[3];
    plVar4 = &local_90;
  }
  else {
    local_90 = *plVar3;
    plVar4 = (long *)*plVar2;
  }
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)plVar4);
  if (plVar4 != &local_90) {
    operator_delete(plVar4,local_90 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)code_ptr);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return;
}

Assistant:

void InitializeFromPackedBuf(const StructDef &struct_def,
                               std::string *code_ptr) const {
    auto &code = *code_ptr;
    const auto struct_var = namer_.Variable(struct_def);
    const auto struct_type = namer_.Type(struct_def);

    code += GenIndents(1) + "@classmethod";
    code += GenIndents(1) + "def InitFromPackedBuf(cls, buf, pos=0):";
    code += GenIndents(2) +
            "n = flatbuffers.encode.Get(flatbuffers.packer.uoffset, buf, pos)";
    code += GenIndents(2) + "return cls.InitFromBuf(buf, pos+n)";
    code += "\n";
  }